

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O3

void __thiscall
wasm::GeneticLearner<Order,_double,_Generator>::sort(GeneticLearner<Order,_double,_Generator> *this)

{
  long lVar1;
  ulong uVar2;
  GeneticLearner<Order,_double,_Generator> *in_RSI;
  __normal_iterator<std::unique_ptr<Order,_std::default_delete<Order>_>_*,_std::vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>_>
  __i;
  GeneticLearner<Order,_double,_Generator> *pGVar3;
  
  if (this != in_RSI) {
    uVar2 = (long)in_RSI - (long)this >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
              (this,in_RSI,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)in_RSI - (long)this < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
                (this);
      return;
    }
    pGVar3 = (GeneticLearner<Order,_double,_Generator> *)((this->noise)._M_x + 0xc);
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
              (this,pGVar3);
    for (; pGVar3 != in_RSI;
        pGVar3 = (GeneticLearner<Order,_double,_Generator> *)&pGVar3->population) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,__gnu_cxx::__ops::_Val_comp_iter<wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>>
                (pGVar3);
    }
  }
  return;
}

Assistant:

void sort() {
    std::sort(population.begin(),
              population.end(),
              [](const unique_ptr& left, const unique_ptr& right) {
                return left->getFitness() > right->getFitness();
              });
  }